

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

bool __thiscall RoboClaw::ReadBuffers(RoboClaw *this,uint8_t *depth1,uint8_t *depth2)

{
  uint16_t uVar1;
  bool valid;
  bool local_19;
  
  uVar1 = Read2(this,this->m_address,'/',&local_19);
  if (local_19 == true) {
    *depth1 = (uint8_t)(uVar1 >> 8);
    *depth2 = (uint8_t)uVar1;
  }
  return local_19;
}

Assistant:

bool RoboClaw::ReadBuffers( uint8_t &depth1, uint8_t &depth2)
{
    bool valid;
    uint16_t value = Read2( m_address, GETBUFFERS,&valid);
    if(valid)
    {
        depth1 = value>>8;
        depth2 = value;
    }
    return valid;
}